

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser_test.cc
# Opt level: O0

void __thiscall CLParserTestFilterInputFilename::Run(CLParserTestFilterInputFilename *this)

{
  Test *pTVar1;
  bool bVar2;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  CLParserTestFilterInputFilename *local_10;
  CLParserTestFilterInputFilename *this_local;
  
  pTVar1 = g_current_test;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"foobar.cc",&local_31);
  bVar2 = CLParser::FilterInputFilename(&local_30);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clparser_test.cc"
                     ,0x25,"CLParser::FilterInputFilename(\"foobar.cc\")");
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  pTVar1 = g_current_test;
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"foo bar.cc",&local_69);
    bVar2 = CLParser::FilterInputFilename(&local_68);
    bVar2 = testing::Test::Check
                      (pTVar1,bVar2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clparser_test.cc"
                       ,0x26,"CLParser::FilterInputFilename(\"foo bar.cc\")");
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    pTVar1 = g_current_test;
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"baz.c",&local_91);
      bVar2 = CLParser::FilterInputFilename(&local_90);
      bVar2 = testing::Test::Check
                        (pTVar1,bVar2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clparser_test.cc"
                         ,0x27,"CLParser::FilterInputFilename(\"baz.c\")");
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
      pTVar1 = g_current_test;
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"FOOBAR.CC",&local_b9);
        bVar2 = CLParser::FilterInputFilename(&local_b8);
        bVar2 = testing::Test::Check
                          (pTVar1,bVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clparser_test.cc"
                           ,0x28,"CLParser::FilterInputFilename(\"FOOBAR.CC\")");
        std::__cxx11::string::~string((string *)&local_b8);
        std::allocator<char>::~allocator(&local_b9);
        pTVar1 = g_current_test;
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e0,
                     "src\\cl_helper.cc(166) : fatal error C1075: end of file found ...",&local_e1);
          bVar2 = CLParser::FilterInputFilename(&local_e0);
          bVar2 = testing::Test::Check
                            (pTVar1,(bool)(~bVar2 & 1),
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clparser_test.cc"
                             ,0x2c,
                             "CLParser::FilterInputFilename( \"src\\\\cl_helper.cc(166) : fatal error C1075: end \" \"of file found ...\")"
                            );
          std::__cxx11::string::~string((string *)&local_e0);
          std::allocator<char>::~allocator(&local_e1);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            testing::Test::AddAssertionFailure(g_current_test);
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST(CLParserTest, FilterInputFilename) {
  ASSERT_TRUE(CLParser::FilterInputFilename("foobar.cc"));
  ASSERT_TRUE(CLParser::FilterInputFilename("foo bar.cc"));
  ASSERT_TRUE(CLParser::FilterInputFilename("baz.c"));
  ASSERT_TRUE(CLParser::FilterInputFilename("FOOBAR.CC"));

  ASSERT_FALSE(CLParser::FilterInputFilename(
                   "src\\cl_helper.cc(166) : fatal error C1075: end "
                   "of file found ..."));
}